

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmosSyncChannel_Mixer.cpp
# Opt level: O1

AtmosSyncChannelMixer * __thiscall ASDCP::AtmosSyncChannelMixer::Reset(AtmosSyncChannelMixer *this)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long in_RSI;
  Result_t aRStack_88 [104];
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  puVar2 = *(undefined8 **)(in_RSI + 0x10);
  if (*(undefined8 **)(in_RSI + 8) != puVar2) {
    iVar1 = *(int *)&this->_vptr_AtmosSyncChannelMixer;
    puVar3 = *(undefined8 **)(in_RSI + 8);
    while (-1 < iVar1) {
      (**(code **)(*(long *)*puVar3 + 0x28))(aRStack_88);
      Kumu::Result_t::operator=((Result_t *)this,aRStack_88);
      Kumu::Result_t::~Result_t(aRStack_88);
      if (puVar3 + 1 == puVar2) {
        return this;
      }
      puVar3 = puVar3 + 1;
      iVar1 = *(int *)&this->_vptr_AtmosSyncChannelMixer;
    }
  }
  return this;
}

Assistant:

Result_t
ASDCP::AtmosSyncChannelMixer::Reset()
{
  Result_t result = RESULT_OK;
  SourceList::iterator it;
  SourceList::iterator lastInput = m_inputs.end();

  for ( it = m_inputs.begin(); it != lastInput && ASDCP_SUCCESS(result) ; ++it )
    result = (*it)->Reset();

  return result;
}